

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void CEditor::ReplaceImage(char *pFileName,int StorageType,void *pUser)

{
  int iVar1;
  CEditorImage *this;
  void *p;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  CLayerTiles *pLayer;
  long lVar8;
  long in_FS_OFFSET;
  CEditorImage ImgInfo;
  CEditorImage local_1e8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e8.m_Texture.m_Id = -1;
  local_1e8.m_External = 0;
  local_1e8.m_aName[0] = '\0';
  local_1e8.super_CImageInfo.m_Width = 0;
  local_1e8.super_CImageInfo.m_Height = 0;
  local_1e8.super_CImageInfo.m_pData = (void *)0x0;
  local_1e8.super_CImageInfo.m_Format = 0;
  local_1e8.m_pAutoMapper = (IAutoMapper *)0x0;
  local_1e8.m_pEditor = (CEditor *)pUser;
  iVar4 = (**(code **)(**(long **)((long)pUser + 0x30) + 0x70))
                    (*(long **)((long)pUser + 0x30),&local_1e8,pFileName,StorageType);
  if (iVar4 != 0) {
    this = *(CEditorImage **)
            (*(long *)((long)pUser + 0x1260) + (long)*(int *)((long)pUser + 0x10f0) * 8);
    iVar4 = this->m_External;
    (**(code **)(**(long **)((long)pUser + 0x30) + 0x78))
              (*(long **)((long)pUser + 0x30),&this->m_Texture);
    p = (this->super_CImageInfo).m_pData;
    if (p != (void *)0x0) {
      mem_free(p);
      (this->super_CImageInfo).m_pData = (void *)0x0;
    }
    if (this->m_pAutoMapper != (IAutoMapper *)0x0) {
      (*this->m_pAutoMapper->_vptr_IAutoMapper[1])();
      this->m_pAutoMapper = (IAutoMapper *)0x0;
      iVar1 = *(int *)((long)pUser + 0x125c);
      if (0 < (long)iVar1) {
        lVar8 = *(long *)((long)pUser + 0x1250);
        lVar5 = 0;
        do {
          lVar2 = *(long *)(lVar8 + lVar5 * 8);
          lVar6 = (long)*(int *)(lVar2 + 0x14);
          if (0 < lVar6) {
            lVar2 = *(long *)(lVar2 + 8);
            lVar7 = 0;
            do {
              lVar3 = *(long *)(lVar2 + lVar7 * 8);
              if ((*(int *)(lVar3 + 0x1c) == 2) &&
                 (*(int *)(lVar3 + 0x30) == *(int *)((long)pUser + 0x10f0))) {
                *(undefined4 *)(lVar3 + 0x70) = 0;
                *(undefined1 *)(lVar3 + 0x74) = 0;
              }
              lVar7 = lVar7 + 1;
            } while (lVar6 != lVar7);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar1);
      }
    }
    memcpy(this,&local_1e8,0x1b0);
    this->m_External = iVar4;
    ExtractName(pFileName,this->m_aName,0x80);
    CEditorImage::LoadAutoMapper(this);
    iVar4 = (**(code **)(**(long **)((long)pUser + 0x30) + 0x80))
                      (*(long **)((long)pUser + 0x30),local_1e8.super_CImageInfo._0_8_ & 0xffffffff,
                       local_1e8.super_CImageInfo.m_Height,local_1e8.super_CImageInfo.m_Format,
                       local_1e8.super_CImageInfo.m_pData,0xffffffff,8);
    (this->m_Texture).m_Id = iVar4;
    local_1e8.super_CImageInfo.m_pData = (void *)0x0;
    SortImages((CEditor *)pUser);
    if (0 < *(int *)((long)pUser + 0x126c)) {
      lVar8 = 0;
      do {
        iVar4 = str_comp((char *)(*(long *)(*(long *)((long)pUser + 0x1260) + lVar8 * 8) + 0x28),
                         this->m_aName);
        if (iVar4 == 0) {
          *(int *)((long)pUser + 0x10f0) = (int)lVar8;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < *(int *)((long)pUser + 0x126c));
    }
    *(undefined4 *)((long)pUser + 0x47c) = 0;
  }
  CEditorImage::~CEditorImage(&local_1e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::ReplaceImage(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = (CEditor *)pUser;
	CEditorImage ImgInfo(pEditor);
	if(!pEditor->Graphics()->LoadPNG(&ImgInfo, pFileName, StorageType))
		return;

	CEditorImage *pImg = pEditor->m_Map.m_lImages[pEditor->m_SelectedImage];
	int External = pImg->m_External;
	pEditor->Graphics()->UnloadTexture(&(pImg->m_Texture));
	if(pImg->m_pData)
	{
		mem_free(pImg->m_pData);
		pImg->m_pData = 0;
	}
	if(pImg->m_pAutoMapper)
	{
		delete pImg->m_pAutoMapper;
		pImg->m_pAutoMapper = 0;
		for (int g = 0; g < pEditor->m_Map.m_lGroups.size(); g++)
		{
			CLayerGroup *pGroup = pEditor->m_Map.m_lGroups[g];
			for (int l = 0; l < pGroup->m_lLayers.size(); l++)
			{
				if (pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
				{
					CLayerTiles *pLayer = static_cast<CLayerTiles *>(pGroup->m_lLayers[l]);
					//resets live auto map of affected layers
					if (pLayer->m_Image == pEditor->m_SelectedImage)
					{
						pLayer->m_SelectedRuleSet = 0;
						pLayer->m_LiveAutoMap = false;
					}
				}
			}
		}
	}
	*pImg = ImgInfo;
	pImg->m_External = External;
	pEditor->ExtractName(pFileName, pImg->m_aName, sizeof(pImg->m_aName));
	pImg->LoadAutoMapper();
	pImg->m_Texture = pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
	ImgInfo.m_pData = 0;
	pEditor->SortImages();
	for(int i = 0; i < pEditor->m_Map.m_lImages.size(); ++i)
	{
		if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, pImg->m_aName))
			pEditor->m_SelectedImage = i;
	}
	pEditor->m_Dialog = DIALOG_NONE;
}